

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O0

void remora::bindings::
     matrix_assign<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
               (matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1,
               matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
               *param_2)

{
  dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
  *pdVar1;
  unsigned_long *puVar2;
  double *pdVar3;
  reference pdVar4;
  size_type j_1;
  size_type i_1;
  size_type i;
  size_type j;
  size_t blockSizej;
  size_t blockSizei;
  size_type jblock;
  size_type iblock;
  size_type size2;
  size_type size1;
  matrix_element<const_double,_remora::column_major> e_elem;
  value_type blockStorage [8] [8];
  size_t blockSize;
  double j_00;
  dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
  *in_stack_fffffffffffffd70;
  dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>
  *in_stack_fffffffffffffd80;
  matrix_element<const_double,_remora::column_major> *pmVar5;
  unsigned_long local_278;
  matrix_element<const_double,_remora::column_major> *local_270;
  unsigned_long local_268;
  dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
  *local_260;
  ulong local_258;
  ulong local_250;
  size_type local_248;
  size_type local_240;
  dense_matrix_storage<const_double,_remora::dense_tag> local_238;
  double local_228 [65];
  unsigned_long local_20;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_18;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  
  local_20 = 8;
  local_18 = param_2;
  local_10 = param_1;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(param_2);
  local_238 = (dense_matrix_storage<const_double,_remora::dense_tag>)
              dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>
              ::elements(in_stack_fffffffffffffd80);
  pdVar1 = matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_10);
  local_240 = dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
              ::size1(pdVar1);
  pdVar1 = matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_10);
  local_248 = dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
              ::size2(pdVar1);
  for (local_250 = 0; local_250 < local_240; local_250 = local_250 + 8) {
    for (local_258 = 0; local_258 < local_248; local_258 = local_258 + 8) {
      local_268 = local_240 - local_250;
      puVar2 = std::min<unsigned_long>(&local_20,&local_268);
      local_260 = (dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
                   *)*puVar2;
      local_278 = local_248 - local_258;
      puVar2 = std::min<unsigned_long>(&local_20,&local_278);
      local_270 = (matrix_element<const_double,_remora::column_major> *)*puVar2;
      for (pmVar5 = (matrix_element<const_double,_remora::column_major> *)0x0; pmVar5 < local_270;
          pmVar5 = (matrix_element<const_double,_remora::column_major> *)
                   ((long)&(pmVar5->m_storage).values + 1)) {
        for (pdVar1 = (dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
                       *)0x0; pdVar1 < local_260;
            pdVar1 = (dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
                      *)((long)&pdVar1->m_values + 1)) {
          pdVar3 = device_traits<remora::cpu_tag>::
                   matrix_element<const_double,_remora::column_major>::operator()
                             (pmVar5,(size_t)pdVar1,(size_t)in_stack_fffffffffffffd70);
          local_228[(long)(&(pmVar5->m_storage).values + (long)pdVar1)] = *pdVar3;
        }
      }
      for (in_stack_fffffffffffffd70 =
                (dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
                 *)0x0; in_stack_fffffffffffffd70 < local_260;
          in_stack_fffffffffffffd70 =
               (dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
                *)((long)&in_stack_fffffffffffffd70->m_values + 1)) {
        for (pmVar5 = (matrix_element<const_double,_remora::column_major> *)0x0; pmVar5 < local_270;
            pmVar5 = (matrix_element<const_double,_remora::column_major> *)
                     ((long)&(pmVar5->m_storage).values + 1)) {
          j_00 = local_228[(long)(&(pmVar5->m_storage).values + (long)in_stack_fffffffffffffd70)];
          matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
          ::operator()(local_10);
          pdVar4 = dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>
                   ::operator()(in_stack_fffffffffffffd70,(size_type)pmVar5,(size_type)j_00);
          *pdVar4 = j_00;
        }
      }
    }
  }
  return;
}

Assistant:

void matrix_assign(
	matrix_expression<M, cpu_tag>& m,
	matrix_expression<E, cpu_tag> const& e,
	row_major, column_major,dense_tag, dense_tag
) {
	//compute blockwise and wrelem the transposed block.
	std::size_t const blockSize = 8;
	typename M::value_type blockStorage[blockSize][blockSize];

	typedef typename M::size_type size_type;
	auto e_elem = e().elements();
	
	size_type size1 = m().size1();
	size_type size2 = m().size2();
	for (size_type iblock = 0; iblock < size1; iblock += blockSize){
		for (size_type jblock = 0; jblock < size2; jblock += blockSize){
			std::size_t blockSizei = std::min(blockSize,size1-iblock);
			std::size_t blockSizej = std::min(blockSize,size2-jblock);

			//compute block values
			for (size_type j = 0; j < blockSizej; ++j){
				for (size_type i = 0; i < blockSizei; ++i){
					blockStorage[i][j] = e_elem(iblock+i,jblock+j);
				}
			}

			//copy block in a different order to m
			for (size_type i = 0; i < blockSizei; ++i){
				for (size_type j = 0; j < blockSizej; ++j){
					m()(iblock+i,jblock+j) = blockStorage[i][j];
				}
			}
		}
	}
}